

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckOperator.cxx
# Opt level: O0

bool __thiscall
kws::Parser::CheckOperator
          (Parser *this,uint before,uint after,unsigned_long maxSize,
          bool doNotCheckInsideParenthesis)

{
  bool bVar1;
  Parser *pPVar2;
  Parser *pPVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  char *pcVar7;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  byte in_R8B;
  bool bVar8;
  bool in_stack_00000067;
  unsigned_long in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  char *in_stack_00000078;
  Parser *in_stack_00000080;
  size_t tmpoperatorPos;
  Error error;
  uint aft;
  long i;
  uint bef;
  size_t operatorPos;
  bool doNotCheck;
  bool hasErrors;
  char *val;
  size_t length;
  Parser *in_stack_fffffffffffffe68;
  Parser *in_stack_fffffffffffffe70;
  Parser *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe98;
  Parser *in_stack_fffffffffffffea0;
  undefined5 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  Parser *in_stack_fffffffffffffeb0;
  Parser *in_stack_fffffffffffffeb8;
  bool local_11a;
  allocator local_f1;
  string local_f0 [32];
  Parser *local_d0;
  string *local_c8;
  string *local_c0;
  undefined8 local_b8;
  string local_b0 [36];
  uint local_8c;
  Parser *local_88;
  uint local_7c;
  byte local_75;
  byte local_62;
  allocator local_61;
  string local_60 [32];
  Parser *local_40;
  byte local_32;
  byte local_31;
  char *local_30;
  undefined8 local_28;
  byte local_19;
  uint local_10;
  uint local_c;
  
  local_19 = in_R8B & 1;
  *(undefined1 *)(in_RDI + 0x47) = 1;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::__cxx11::string::operator=
            ((string *)(in_RDI + 0x338),"Number of spaces for the operators should be: before=");
  local_28 = 10;
  local_30 = (char *)operator_new__(10);
  snprintf(local_30,10,"%d",(ulong)local_c);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x338),local_30);
  snprintf(local_30,10,", after=%d",(ulong)local_10);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x338),local_30);
  if (local_30 != (char *)0x0) {
    operator_delete__(local_30);
  }
  local_31 = 0;
  bVar4 = FindOperator(in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000070,
                       in_stack_00000068,in_stack_00000067);
  if (!bVar4) {
    local_31 = 1;
  }
  bVar4 = FindOperator(in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000070,
                       in_stack_00000068,in_stack_00000067);
  if (!bVar4) {
    local_31 = 1;
  }
  bVar4 = FindOperator(in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000070,
                       in_stack_00000068,in_stack_00000067);
  if (!bVar4) {
    local_31 = 1;
  }
  bVar4 = FindOperator(in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000070,
                       in_stack_00000068,in_stack_00000067);
  if (!bVar4) {
    local_31 = 1;
  }
  bVar4 = FindOperator(in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000070,
                       in_stack_00000068,in_stack_00000067);
  if (!bVar4) {
    local_31 = 1;
  }
  bVar4 = FindOperator(in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000070,
                       in_stack_00000068,in_stack_00000067);
  if (!bVar4) {
    local_31 = 1;
  }
  local_32 = 0;
  local_40 = (Parser *)std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e627a);
  local_62 = 0;
  local_75 = 0;
  if ((local_19 & 1) != 0) {
    std::allocator<char>::allocator();
    local_62 = 1;
    std::__cxx11::string::string(local_60,"",&local_61);
    local_75 = 1;
    bVar4 = IsBetweenCharsFast(in_stack_fffffffffffffeb8,
                               (char)((ulong)in_stack_fffffffffffffeb0 >> 0x38),
                               (char)((ulong)in_stack_fffffffffffffeb0 >> 0x30),
                               CONCAT17(in_stack_fffffffffffffeaf,
                                        CONCAT16(in_stack_fffffffffffffeae,
                                                 CONCAT15(in_stack_fffffffffffffead,
                                                          in_stack_fffffffffffffea8))),
                               SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0),
                               in_stack_fffffffffffffe98);
    local_11a = true;
    if (bVar4) goto LAB_001b2b1f;
  }
  pPVar2 = local_40;
  lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e6279);
  pPVar3 = local_40;
  local_11a = true;
  if (pPVar2 != (Parser *)(lVar6 + 1U)) {
    lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e6285);
    pPVar2 = local_40;
    local_11a = true;
    if (pPVar3 != (Parser *)(lVar6 + 1U)) {
      lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e627c);
      pPVar3 = local_40;
      local_11a = true;
      if (pPVar2 != (Parser *)(lVar6 + 1U)) {
        lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e6282);
        local_11a = true;
        if (pPVar3 != (Parser *)(lVar6 + 1U)) {
          in_stack_fffffffffffffeb8 = local_40;
          lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e6276);
          local_11a = true;
          if (in_stack_fffffffffffffeb8 != (Parser *)(lVar6 + 1U)) {
            in_stack_fffffffffffffeb0 = local_40;
            lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e662d);
            local_11a = in_stack_fffffffffffffeb0 == (Parser *)(lVar6 + 9U);
          }
        }
      }
    }
  }
LAB_001b2b1f:
  if ((local_75 & 1) != 0) {
    std::__cxx11::string::~string(local_60);
  }
  if ((local_62 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  if ((local_11a & 1U) != 0) {
    local_32 = 1;
  }
  do {
    if (local_40 == (Parser *)0xffffffffffffffff) {
      return (bool)((local_31 ^ 0xff) & 1);
    }
    if ((local_32 & 1) == 0) {
      local_7c = 0;
      local_88 = local_40;
      while( true ) {
        local_88 = (Parser *)
                   ((long)&local_88[-1].m_IfElseEndifList.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        bVar4 = false;
        if (0 < (long)local_88) {
          pcVar7 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
          bVar4 = *pcVar7 == ' ';
        }
        if (!bVar4) break;
        local_7c = local_7c + 1;
      }
      local_8c = 0;
      in_stack_fffffffffffffeae = 0;
      local_88 = local_40;
      while( true ) {
        local_88 = (Parser *)
                   ((long)&(local_88->m_ErrorList).
                           super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1);
        in_stack_fffffffffffffea0 = local_88;
        lVar6 = std::__cxx11::string::size();
        in_stack_fffffffffffffead = false;
        if ((long)in_stack_fffffffffffffea0 < lVar6) {
          pcVar7 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
          in_stack_fffffffffffffead = *pcVar7 == ' ';
        }
        if ((bool)in_stack_fffffffffffffead == false) break;
        local_8c = local_8c + 1;
      }
      if ((local_7c != local_c) || (local_8c != local_10)) {
        ErrorStruct::ErrorStruct((ErrorStruct *)0x1b2d5d);
        in_stack_fffffffffffffe98 =
             (string *)
             GetLineNumber(in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70,
                           SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0));
        local_b8 = 0x17;
        local_c8 = in_stack_fffffffffffffe98;
        local_c0 = in_stack_fffffffffffffe98;
        std::__cxx11::string::operator=(local_b0,"Spaces around operator are wrong");
        local_31 = 1;
        ErrorStruct::~ErrorStruct((ErrorStruct *)0x1b2dd2);
      }
    }
    local_32 = 0;
    local_d0 = (Parser *)std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e627a);
    bVar1 = false;
    bVar4 = false;
    if ((local_19 & 1) == 0) {
LAB_001b2ede:
      in_stack_fffffffffffffe78 = local_d0;
      lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e6279);
      bVar8 = true;
      if (in_stack_fffffffffffffe78 != (Parser *)(lVar6 + 1U)) {
        in_stack_fffffffffffffe70 = local_d0;
        lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e6285);
        bVar8 = true;
        if (in_stack_fffffffffffffe70 != (Parser *)(lVar6 + 1U)) {
          in_stack_fffffffffffffe68 = local_d0;
          lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e627c);
          pPVar2 = local_d0;
          bVar8 = true;
          if (in_stack_fffffffffffffe68 != (Parser *)(lVar6 + 1U)) {
            lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e6282);
            pPVar3 = local_d0;
            bVar8 = true;
            if (pPVar2 != (Parser *)(lVar6 + 1U)) {
              lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e6276);
              pPVar2 = local_d0;
              bVar8 = true;
              if (pPVar3 != (Parser *)(lVar6 + 1U)) {
                lVar6 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e662d);
                bVar8 = pPVar2 == (Parser *)(lVar6 + 8U);
              }
            }
          }
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      bVar1 = true;
      std::__cxx11::string::string(local_f0,"",&local_f1);
      bVar4 = true;
      bVar5 = IsBetweenCharsFast(in_stack_fffffffffffffeb8,
                                 (char)((ulong)in_stack_fffffffffffffeb0 >> 0x38),
                                 (char)((ulong)in_stack_fffffffffffffeb0 >> 0x30),
                                 CONCAT17(local_11a,
                                          CONCAT16(in_stack_fffffffffffffeae,
                                                   CONCAT15(in_stack_fffffffffffffead,
                                                            in_stack_fffffffffffffea8))),
                                 SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0),
                                 in_stack_fffffffffffffe98);
      bVar8 = true;
      if (!bVar5) goto LAB_001b2ede;
    }
    if (bVar4) {
      std::__cxx11::string::~string(local_f0);
    }
    if (bVar1) {
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
    if (bVar8) {
      local_32 = 1;
    }
    local_40 = local_d0;
  } while( true );
}

Assistant:

bool Parser::CheckOperator(unsigned int before, unsigned int after,
                           unsigned long maxSize,
                           bool doNotCheckInsideParenthesis)
{
  m_TestsDone[OPERATOR] = true;
  m_TestsDescription[OPERATOR] = "Number of spaces for the operators should be: before=";
  constexpr size_t length = 10;
  char* val = new char[length];
  snprintf(val,length,"%d",before);
  m_TestsDescription[OPERATOR] += val;  
  snprintf(val,length,", after=%d",after);
  m_TestsDescription[OPERATOR] += val;
  delete [] val;

  bool hasErrors = false;

  if(!this->FindOperator("==",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }
  
  if(!this->FindOperator("!=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("-=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("/=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("+=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("*=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  // We check the = operator but we want to make sure that it is not part
  // of the previous defined operator
  bool doNotCheck = false;
  size_t operatorPos = m_BufferNoComment.find("=",0);

  if( (doNotCheckInsideParenthesis && this->IsBetweenCharsFast('(',')',operatorPos,false)) 
    || (operatorPos == m_BufferNoComment.find("!=",0)+1)
    || (operatorPos == m_BufferNoComment.find("*=",0)+1)
    || (operatorPos == m_BufferNoComment.find("-=",0)+1)
    || (operatorPos == m_BufferNoComment.find("+=",0)+1)
    || (operatorPos == m_BufferNoComment.find("==",0)+1)
    || (operatorPos == m_BufferNoComment.find("operator",0)+9)
    )
    {
    doNotCheck = true;
    }

  while(operatorPos != std::string::npos) 
    {
    if(!doNotCheck)
      {
      // Check number of space before
      unsigned int bef = 0;
      long int i = static_cast<long int>(operatorPos)-1;
      while((i>0) && (m_BufferNoComment[i] == ' '))
        {
        bef++;
        i--;
        }

      // Check number of space after
      unsigned int aft = 0;
      i = static_cast<long int>(operatorPos)+1;
      while((i<(long int)m_BufferNoComment.size()) && (m_BufferNoComment[i] == ' '))
        {
        aft++;
        i++;
        }

      if(bef != before || aft != after)
        {
        Error error;
        error.line = this->GetLineNumber(operatorPos,true);
        error.line2 = error.line;
        error.number = OPERATOR;
        error.description = "Spaces around operator are wrong";
        //m_ErrorList.push_back(error);
        hasErrors = true;
        }
      }

    doNotCheck = false;
    size_t tmpoperatorPos = m_BufferNoComment.find("=",operatorPos+1);

    if( (doNotCheckInsideParenthesis && this->IsBetweenCharsFast('(',')',tmpoperatorPos,false)) 
    ||  (tmpoperatorPos == m_BufferNoComment.find("!=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("*=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("-=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("+=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("==",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("operator",operatorPos+1)+8)
    )
      {
      doNotCheck = true;
      }

    operatorPos = tmpoperatorPos;
      
    }
  

  return !hasErrors;
}